

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void * crnlib::task_pool::thread_func(void *pContext)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_38 [8];
  task tsk;
  task_pool *pPool;
  void *pContext_local;
  
  tsk._24_8_ = pContext;
  task::task((task *)local_38);
  while ((uVar2 = semaphore::wait((semaphore *)(tsk._24_8_ + 0xa18),(void *)0xffffffff),
         (uVar2 & 1) != 0 && (*(long *)(tsk._24_8_ + 0xa68) == 0))) {
    bVar1 = tsstack<crnlib::task_pool::task,_64U>::pop
                      ((tsstack<crnlib::task_pool::task,_64U> *)tsk._24_8_,(task *)local_38);
    if (bVar1) {
      process_task((task_pool *)tsk._24_8_,(task *)local_38);
    }
  }
  return (void *)0x0;
}

Assistant:

void* task_pool::thread_func(void* pContext) {
  task_pool* pPool = static_cast<task_pool*>(pContext);
  task tsk;

  for (;;) {
    if (!pPool->m_tasks_available.wait())
      break;

    if (pPool->m_exit_flag)
      break;

    if (pPool->m_task_stack.pop(tsk)) {
      pPool->process_task(tsk);
    }
  }

  return NULL;
}